

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int av1_compute_num_fp_contexts(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  byte bVar1;
  int iVar2;
  AV1_COMP *pAVar3;
  SequenceHeader *pSVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  (ppi->p_mt_info).num_mod_workers[10] = 0;
  iVar5 = av1_check_fpmt_config(ppi,oxcf);
  if (iVar5 == 0) {
    iVar5 = 1;
  }
  else {
    pAVar3 = ppi->cpi;
    pSVar4 = (pAVar3->common).seq_params;
    bVar1 = (byte)pSVar4->mib_size_log2;
    uVar8 = ~(-1 << (bVar1 & 0x1f));
    iVar5 = (int)((pAVar3->common).mi_params.mi_rows + uVar8) >> (bVar1 & 0x1f);
    iVar9 = ((int)(uVar8 + (pAVar3->common).mi_params.mi_cols) >> (bVar1 & 0x1f)) + 1 >> 1;
    if (iVar5 <= iVar9) {
      iVar9 = iVar5;
    }
    iVar5 = (oxcf->frm_dim_cfg).width;
    iVar7 = (oxcf->frm_dim_cfg).height;
    if (iVar5 < iVar7) {
      iVar7 = iVar5;
    }
    lVar6 = (ulong)(pSVar4->sb_size == BLOCK_64X64 && 0x1e0 < iVar7) * 4;
    iVar5 = (*(int *)(&DAT_004d8b98 + lVar6) + iVar9) / *(int *)(&DAT_004df938 + lVar6);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    iVar7 = oxcf->max_threads;
    iVar5 = iVar7 / iVar5;
    if (((0 < (oxcf->tile_cfg).tile_columns) || (iVar10 = iVar5, 0 < (oxcf->tile_cfg).tile_rows)) &&
       (iVar10 = 1, 3 < iVar5)) {
      iVar10 = iVar5;
    }
    iVar5 = 4;
    if (iVar10 < 4) {
      iVar5 = iVar10;
    }
    iVar10 = 1;
    if (1 < iVar5) {
      iVar10 = iVar5;
    }
    iVar2 = ppi->num_fp_contexts;
    iVar5 = iVar2;
    if (iVar10 < iVar2) {
      iVar5 = iVar10;
    }
    if (iVar2 == 1) {
      iVar5 = iVar10;
    }
    if (1 < iVar5) {
      iVar10 = iVar9 * iVar5;
      if (iVar7 <= iVar9 * iVar5) {
        iVar10 = iVar7;
      }
      (ppi->p_mt_info).num_mod_workers[10] = iVar10;
    }
  }
  return iVar5;
}

Assistant:

int av1_compute_num_fp_contexts(AV1_PRIMARY *ppi, AV1EncoderConfig *oxcf) {
  ppi->p_mt_info.num_mod_workers[MOD_FRAME_ENC] = 0;
  if (!av1_check_fpmt_config(ppi, oxcf)) {
    return 1;
  }
  int max_num_enc_workers = compute_max_num_enc_workers(
      &ppi->cpi->common.mi_params, ppi->cpi->common.seq_params->mib_size_log2);
  // Scaling factors and rounding factors used to tune worker_per_frame
  // computation.
  int rounding_factor[2] = { 2, 4 };
  int scaling_factor[2] = { 4, 8 };
  int is_480p_or_lesser =
      AOMMIN(oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height) <= 480;
  int is_sb_64 = 0;
  if (ppi->cpi != NULL)
    is_sb_64 = ppi->cpi->common.seq_params->sb_size == BLOCK_64X64;
  // A parallel frame encode has at least 1/4th the
  // theoretical limit of max enc workers in default case. For resolutions
  // larger than 480p, if SB size is 64x64, optimal performance is obtained with
  // limit of 1/8.
  int index = (!is_480p_or_lesser && is_sb_64) ? 1 : 0;
  int workers_per_frame =
      AOMMAX(1, (max_num_enc_workers + rounding_factor[index]) /
                    scaling_factor[index]);
  int max_threads = oxcf->max_threads;
  int num_fp_contexts = max_threads / workers_per_frame;
  // Based on empirical results, FPMT gains with multi-tile are significant when
  // more parallel frames are available. Use FPMT with multi-tile encode only
  // when sufficient threads are available for parallel encode of
  // MAX_PARALLEL_FRAMES frames.
  if (oxcf->tile_cfg.tile_columns > 0 || oxcf->tile_cfg.tile_rows > 0) {
    if (num_fp_contexts < MAX_PARALLEL_FRAMES) num_fp_contexts = 1;
  }

  num_fp_contexts = AOMMAX(1, AOMMIN(num_fp_contexts, MAX_PARALLEL_FRAMES));
  // Limit recalculated num_fp_contexts to ppi->num_fp_contexts.
  num_fp_contexts = (ppi->num_fp_contexts == 1)
                        ? num_fp_contexts
                        : AOMMIN(num_fp_contexts, ppi->num_fp_contexts);
  if (num_fp_contexts > 1) {
    ppi->p_mt_info.num_mod_workers[MOD_FRAME_ENC] =
        AOMMIN(max_num_enc_workers * num_fp_contexts, oxcf->max_threads);
  }
  return num_fp_contexts;
}